

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalPragma,duckdb::unique_ptr<duckdb::BoundPragmaInfo,std::default_delete<duckdb::BoundPragmaInfo>,true>,unsigned_long&>
          (PhysicalPlan *this,
          unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
          *args,unsigned_long *args_1)

{
  PhysicalPragma *this_00;
  _Head_base<0UL,_duckdb::BoundPragmaInfo_*,_false> local_30;
  reference_wrapper<duckdb::PhysicalOperator> local_28;
  
  this_00 = (PhysicalPragma *)ArenaAllocator::AllocateAligned(&this->arena,0x88);
  local_30._M_head_impl =
       (args->
       super_unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundPragmaInfo_*,_std::default_delete<duckdb::BoundPragmaInfo>_>
       .super__Head_base<0UL,_duckdb::BoundPragmaInfo_*,_false>._M_head_impl;
  (args->super_unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>).
  _M_t.super___uniq_ptr_impl<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundPragmaInfo_*,_std::default_delete<duckdb::BoundPragmaInfo>_>.
  super__Head_base<0UL,_duckdb::BoundPragmaInfo_*,_false>._M_head_impl = (BoundPragmaInfo *)0x0;
  PhysicalPragma::PhysicalPragma
            (this_00,(unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>,_true>
                      *)&local_30,*args_1);
  ::std::unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::BoundPragmaInfo,_std::default_delete<duckdb::BoundPragmaInfo>_> *)
              &local_30);
  local_28._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_28);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}